

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_k.c
# Opt level: O1

void test_option_k(void)

{
  wchar_t wVar1;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x10',"foo",L'Ƥ',L'\xffffffff',"foo1");
  wVar1 = systemf("%s -cf archive.tar foo",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x12',0,"0",(long)wVar1,"systemf(\"%s -cf archive.tar foo\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x14',"foo",L'Ƥ',L'\xffffffff',"foo2");
  wVar1 = systemf("%s -rf archive.tar foo",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x16',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar foo\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x18',"bar",L'Ƥ',L'\xffffffff',"bar1");
  wVar1 = systemf("%s -rf archive.tar bar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x1a',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar bar\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x1c',"foo",L'Ƥ',L'\xffffffff',"foo3");
  wVar1 = systemf("%s -rf archive.tar foo",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\x1e',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar foo\", testprog)",
                      (void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L' ',"bar",L'Ƥ',L'\xffffffff',"bar2");
  wVar1 = systemf("%s -rf archive.tar bar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'\"',0,"0",(long)wVar1,"systemf(\"%s -rf archive.tar bar\", testprog)",
                      (void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                     ,L'*',"test1",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'+',"test1");
  wVar1 = systemf("%s -xf ../archive.tar >test.out 2>test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'-',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../archive.tar >test.out 2>test.err\", testprog)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'.',"foo3",L'\x04',"foo");
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'/',"bar2",L'\x04',"bar");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'0',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'1',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'2',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                     ,L'5',"test2",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'6',"test2");
  wVar1 = systemf("%s -xf ../archive.tar -k >test.out 2>test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'8',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../archive.tar -k >test.out 2>test.err\", testprog)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'9',"foo1",L'\x04',"foo");
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L':',"bar1",L'\x04',"bar");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L';',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'<',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'=',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                     ,L'@',"test3",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'A',"test3");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'B',"bar",L'Ƥ',L'\xffffffff',"bar0");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'C',"foo",L'Ƥ',L'\xffffffff',"foo0");
  wVar1 = systemf("%s -xf ../archive.tar >test.out 2>test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'E',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../archive.tar >test.out 2>test.err\", testprog)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'F',"foo3",L'\x04',"foo");
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'G',"bar2",L'\x04',"bar");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'H',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'I',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'J',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                     ,L'M',"test4",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'N',"test4");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'O',"bar",L'Ƥ',L'\xffffffff',"bar0");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'P',"foo",L'Ƥ',L'\xffffffff',"foo0");
  wVar1 = systemf("%s -xf ../archive.tar -k >test.out 2>test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                      ,L'R',0,"0",(long)wVar1,
                      "systemf(\"%s -xf ../archive.tar -k >test.out 2>test.err\", testprog)",
                      (void *)0x0);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'S',"foo0",L'\x04',"foo");
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'T',"bar0",L'\x04',"bar");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'U',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
             ,L'V',"test.err");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_k.c"
                  ,L'W',"..");
  return;
}

Assistant:

DEFINE_TEST(test_option_k)
{
	/*
	 * Create an archive with a couple of different versions of the
	 * same file.
	 */

	assertMakeFile("foo", 0644, "foo1");

	assertEqualInt(0, systemf("%s -cf archive.tar foo", testprog));

	assertMakeFile("foo", 0644, "foo2");

	assertEqualInt(0, systemf("%s -rf archive.tar foo", testprog));

	assertMakeFile("bar", 0644, "bar1");

	assertEqualInt(0, systemf("%s -rf archive.tar bar", testprog));

	assertMakeFile("foo", 0644, "foo3");

	assertEqualInt(0, systemf("%s -rf archive.tar foo", testprog));

	assertMakeFile("bar", 0644, "bar2");

	assertEqualInt(0, systemf("%s -rf archive.tar bar", testprog));

	/*
	 * Now, try extracting from the test archive with various
	 * combinations of -k
	 */

	/* Test 1: No option */
	assertMakeDir("test1", 0755);
	assertChdir("test1");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar >test.out 2>test.err", testprog));
	assertFileContents("foo3", 4, "foo");
	assertFileContents("bar2", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 2: With -k, we should just get the first versions. */
	assertMakeDir("test2", 0755);
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar -k >test.out 2>test.err", testprog));
	assertFileContents("foo1", 4, "foo");
	assertFileContents("bar1", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 3: Without -k, existing files should get overwritten */
	assertMakeDir("test3", 0755);
	assertChdir("test3");
	assertMakeFile("bar", 0644, "bar0");
	assertMakeFile("foo", 0644, "foo0");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar >test.out 2>test.err", testprog));
	assertFileContents("foo3", 4, "foo");
	assertFileContents("bar2", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 4: With -k, existing files should not get overwritten */
	assertMakeDir("test4", 0755);
	assertChdir("test4");
	assertMakeFile("bar", 0644, "bar0");
	assertMakeFile("foo", 0644, "foo0");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar -k >test.out 2>test.err", testprog));
	assertFileContents("foo0", 4, "foo");
	assertFileContents("bar0", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");
}